

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O1

void __thiscall actorpp::Actor::Actor(Actor *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->impl).super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00183c40;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[3]._M_use_count = 0;
  p_Var1[3]._M_weak_count = 0;
  p_Var1[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[4]._M_use_count = 0;
  p_Var1[4]._M_weak_count = 0;
  p_Var1[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[5]._M_use_count = 0;
  p_Var1[5]._M_weak_count = 0;
  p_Var1[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  std::condition_variable::condition_variable((condition_variable *)&p_Var1[3]._M_use_count);
  (this->impl).super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (this->impl).super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  return;
}

Assistant:

Actor() : impl(std::make_shared<detail::ActorImpl>()) {}